

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ZeroSlopeTestCase::testPolygonOffset
          (ZeroSlopeTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  RenderContext *pRVar3;
  TestContext *testCtx;
  TextureFormat TVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar8;
  void *pvVar9;
  long lVar10;
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  ShaderProgram program;
  Surface local_330;
  Surface local_318;
  TextureFormat local_300;
  value_type local_2f8;
  undefined1 local_2d8 [24];
  float local_2c0 [2];
  undefined8 local_2b8;
  float afStack_2b0 [10];
  undefined1 local_288 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270 [4];
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [208];
  ShaderProgram local_108;
  
  local_2b8 = 0x3ecccccdbecccccd;
  afStack_2b0[0] = 0.0;
  afStack_2b0[1] = 1.0;
  afStack_2b0[2] = -0.8;
  afStack_2b0[3] = -0.5;
  afStack_2b0[4] = 0.0;
  afStack_2b0[5] = 1.0;
  afStack_2b0[6] = 0.7;
  afStack_2b0[7] = 0.2;
  afStack_2b0[8] = 0.0;
  afStack_2b0[9] = 1.0;
  TVar2 = (TextureFormat)
          ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
          m_testCtx)->m_log;
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_318,iVar5,iVar5);
  iVar5 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_330,iVar5,iVar5);
  poVar1 = (ostringstream *)(local_288 + 8);
  local_288._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_300 = TVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Setup triangle with coordinates:",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_210);
  poVar1 = (ostringstream *)(local_288 + 8);
  lVar10 = 0xc;
  do {
    local_288._0_4_ = local_300.order;
    local_288._4_4_ = local_300.type;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)local_2c0 + lVar10 + -4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)local_2c0 + lVar10));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)local_2c0 + lVar10 + 4));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
    std::ostream::_M_insert<double>((double)*(float *)((long)&local_2b8 + lVar10));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x3c);
  iVar5 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "#version 300 es\nin highp vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288,&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_270,(value_type *)local_2d8);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar3,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  TVar2 = local_300;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = (**(code **)(lVar10 + 0x780))(local_108.m_program.m_program,"a_position");
  uVar7 = (**(code **)(lVar10 + 0x780))(local_108.m_program.m_program,"a_color");
  if (local_108.m_program.m_info.linkOk != false) {
    (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar10 + 0x1d0))(0x3f800000);
    (**(code **)(lVar10 + 0x188))(0x4100);
    (**(code **)(lVar10 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar10 + 0x1680))(local_108.m_program.m_program);
    (**(code **)(lVar10 + 0x5e0))(0xb71);
    (**(code **)(lVar10 + 0x5e0))(0x8037);
    (**(code **)(lVar10 + 0x610))(uVar6);
    TVar4 = local_300;
    poVar1 = (ostringstream *)(local_288 + 8);
    local_300.order = TVar2.order;
    local_300.type = TVar2.type;
    local_288._0_4_ = local_300.order;
    local_288._4_4_ = local_300.type;
    local_300 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar10 + 0x19f0))(uVar6,4,0x1406,0,0,&local_2b8);
    TVar4 = local_300;
    poVar1 = (ostringstream *)(local_288 + 8);
    local_300.order = TVar2.order;
    local_300.type = TVar2.type;
    local_288._0_4_ = local_300.order;
    local_288._4_4_ = local_300.type;
    local_300 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0).",0x4b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar10 + 0x4a0))(0x207);
    (**(code **)(lVar10 + 0x1028))(0,0);
    (**(code **)(lVar10 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar7);
    (**(code **)(lVar10 + 0x538))(4,0,3);
    TVar4 = local_300;
    poVar1 = (ostringstream *)(local_288 + 8);
    local_300.order = TVar2.order;
    local_300.type = TVar2.type;
    local_288._0_4_ = local_300.order;
    local_288._4_4_ = local_300.type;
    local_300 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0).",0x4c)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    (**(code **)(lVar10 + 0x4a0))(0x202);
    (**(code **)(lVar10 + 0x1028))(0x40800000,0);
    (**(code **)(lVar10 + 0x1858))(0,0,0,0x3f800000,uVar7);
    (**(code **)(lVar10 + 0x538))(4,0,3);
    (**(code **)(lVar10 + 0x518))(uVar6);
    (**(code **)(lVar10 + 0x1680))(0);
    (**(code **)(lVar10 + 0x648))();
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_2f8._M_dataplus._M_p = (pointer)0x300000008;
    pvVar9 = (void *)local_318.m_pixels.m_cap;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      pvVar9 = local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_2f8,local_318.m_width,
               local_318.m_height,1,pvVar9);
    glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_288);
    glu::ShaderProgram::~ShaderProgram(&local_108);
    TVar4 = local_300;
    poVar1 = (ostringstream *)(local_288 + 8);
    local_300.order = TVar2.order;
    local_300.type = TVar2.type;
    local_288._0_4_ = local_300.order;
    local_288._4_4_ = local_300.type;
    local_300 = TVar4;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting black triangle.",0x19);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    pvVar9 = (void *)local_330.m_pixels.m_cap;
    if ((void *)local_330.m_pixels.m_cap != (void *)0x0) {
      pvVar9 = local_330.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_108,local_330.m_width,
               local_330.m_height,1,pvVar9);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_288,(Vec4 *)&local_108);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar3 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    if ((void *)local_318.m_pixels.m_cap != (void *)0x0) {
      local_318.m_pixels.m_cap = (size_t)local_318.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_288,(TextureFormat *)&local_108,local_318.m_width,
               local_318.m_height,1,(void *)local_318.m_pixels.m_cap);
    local_2f8._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_330.m_pixels.m_cap != (void *)0x0) {
      local_330.m_pixels.m_cap = (size_t)local_330.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_108,(TextureFormat *)&local_2f8,local_330.m_width,
               local_330.m_height,1,(void *)local_330.m_pixels.m_cap);
    verifyImages((TestLog *)TVar2,testCtx,pRVar3,(ConstPixelBufferAccess *)local_288,
                 (ConstPixelBufferAccess *)&local_108);
    tcu::Surface::~Surface(&local_330);
    tcu::Surface::~Surface(&local_318);
    return;
  }
  glu::operator<<((TestLog *)TVar2,&local_108);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
             ,0x3ed);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ZeroSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangle[] =
	{
		tcu::Vec4(-0.4f,  0.4f, 0.0f, 1.0f),
		tcu::Vec4(-0.8f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.7f,  0.2f, 0.0f, 1.0f),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// log the triangle
	log << TestLog::Message << "Setup triangle with coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < DE_LENGTH_OF_ARRAY(triangle); ++ndx)
		log << TestLog::Message
				<< "\tx=" << triangle[ndx].x()
				<< "\ty=" << triangle[ndx].y()
				<< "\tz=" << triangle[ndx].z()
				<< "\tw=" << triangle[ndx].w()
				<< TestLog::EndMessage;

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangle);

			log << TestLog::Message << "Draw triangle. Color = Red.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw triangle. Color = Black.\tState: DepthFunc = EQUAL, PolygonOffset(4, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_EQUAL);
			gl.polygonOffset			(4, 0);	// triangle slope == 0
			gl.vertexAttrib4f			(colorLoc, 0.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting black triangle." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}